

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::unsetCursor(QGraphicsItem *this)

{
  QGraphicsScene *this_00;
  QWidget *this_01;
  QGraphicsView **ppQVar1;
  ulong uVar2;
  QGraphicsItem *pQVar3;
  ExtraStruct *pEVar4;
  qsizetype i;
  QGraphicsItemPrivate *pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QPoint local_80;
  QList<QGraphicsView_*> local_78;
  QPoint local_58;
  char *pcStack_50;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (this->d_ptr).d;
  uVar2 = *(ulong *)&pQVar5->field_0x160;
  if ((short)uVar2 < 0) {
    lVar6 = (pQVar5->extras).d.size;
    if (lVar6 != 0) {
      pEVar4 = (pQVar5->extras).d.ptr;
      i = 0;
      do {
        if (pEVar4->type == ExtraCursor) {
          QList<QGraphicsItemPrivate::ExtraStruct>::removeAt(&pQVar5->extras,i);
          pQVar5 = (this->d_ptr).d;
          uVar2 = *(ulong *)&pQVar5->field_0x160;
          break;
        }
        i = i + 1;
        pEVar4 = pEVar4 + 1;
      } while (lVar6 != i);
    }
    *(ulong *)&pQVar5->field_0x160 = uVar2 & 0xffffffffffff7fff;
    this_00 = (QGraphicsScene *)((this->d_ptr).d)->scene;
    if (this_00 != (QGraphicsScene *)0x0) {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views(&local_78,this_00);
      ppQVar1 = local_78.d.ptr;
      if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
        lVar6 = local_78.d.size << 3;
        lVar7 = 0;
        do {
          this_01 = *(QWidget **)((long)ppQVar1 + lVar7);
          if ((this_01->data->widget_attributes & 2) != 0) {
            local_80 = (QPoint)QCursor::pos();
            local_58 = QWidget::mapFromGlobal(this_01,&local_80);
            pQVar3 = QGraphicsView::itemAt((QGraphicsView *)this_01,&local_58);
            if (pQVar3 == this) {
              local_58.xp.m_i = 0;
              local_58.yp.m_i = 0;
              pcStack_50 = (char *)0x0;
              local_48[0] = (QMetaTypeInterface *)0x0;
              QMetaObject::invokeMethodImpl
                        (&this_01->super_QObject,"_q_unsetViewportCursor",AutoConnection,1,
                         (void **)&local_58,&pcStack_50,local_48);
              break;
            }
          }
          lVar7 = lVar7 + 8;
        } while (lVar6 != lVar7);
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::unsetCursor()
{
    if (!d_ptr->hasCursor)
        return;
    d_ptr->unsetExtra(QGraphicsItemPrivate::ExtraCursor);
    d_ptr->hasCursor = 0;
    if (d_ptr->scene) {
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            if (view->underMouse() && view->itemAt(view->mapFromGlobal(QCursor::pos())) == this) {
                QMetaObject::invokeMethod(view, "_q_unsetViewportCursor");
                break;
            }
        }
    }
}